

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char * kj::_::
       fill<kj::CappedArray<char,24ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,32ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
                 (char *target,CappedArray<char,_24UL> *first,ArrayPtr<const_char> *rest,
                 CappedArray<char,_32UL> *rest_1,ArrayPtr<const_char> *rest_2,
                 CappedArray<char,_14UL> *rest_3)

{
  size_t sVar1;
  
  sVar1 = first->currentSize;
  if (sVar1 != 0) {
    memcpy(target,first->content,sVar1);
    target = target + sVar1;
  }
  sVar1 = rest->size_;
  if (sVar1 != 0) {
    memcpy(target,rest->ptr,sVar1);
    target = target + sVar1;
  }
  sVar1 = rest_1->currentSize;
  if (sVar1 != 0) {
    memcpy(target,rest_1->content,sVar1);
    target = target + sVar1;
  }
  sVar1 = rest_2->size_;
  if (sVar1 != 0) {
    memcpy(target,rest_2->ptr,sVar1);
    target = target + sVar1;
  }
  sVar1 = rest_3->currentSize;
  if (sVar1 != 0) {
    memcpy(target,rest_3->content,sVar1);
    target = target + sVar1;
  }
  return target;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}